

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O3

complex<float> * __thiscall
TPZBlockDiagonal<std::complex<float>_>::operator()
          (TPZBlockDiagonal<std::complex<float>_> *this,int64_t row,int64_t col)

{
  long lVar1;
  long lVar2;
  complex<float> *pcVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  lVar1 = (this->fBlockSize).fNElements;
  if (lVar1 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "TPZBlockDiagonal::operator() called with parameters out of range\n",0x41);
    pcVar3 = &operator()::zero;
  }
  else {
    lVar2 = 0;
    lVar7 = 0;
    do {
      lVar6 = lVar7;
      lVar5 = lVar2;
      lVar4 = (long)(this->fBlockSize).fStore[lVar5];
      lVar7 = lVar6 + lVar4;
      if (lVar1 <= lVar5) break;
      lVar2 = lVar5 + 1;
    } while (lVar7 <= row);
    if (lVar1 + 1 == lVar5 + 1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"TPZBlockDiagonal::operator() wrong data structure\n",0x32);
      pcVar3 = &TPZBlockDiagonal<std::complex<float>>::operator()(long,long)::zero;
    }
    else if (col < lVar6 || lVar7 <= col) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "TPZBlockDiagonal::operator(), indices row col out of range\n",0x3b);
      pcVar3 = &TPZBlockDiagonal<std::complex<float>>::operator()(long,long)::zero;
    }
    else {
      pcVar3 = (this->fStorage).fStore +
               (row - lVar6) + (this->fBlockPos).fStore[lVar5] + (col - lVar6) * lVar4;
    }
  }
  return pcVar3;
}

Assistant:

TPZBlockDiagonal<TVar>::~TPZBlockDiagonal ()
{
}